

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_k_means_test.cc
# Opt level: O0

void __thiscall
AV1Kmeans::AV1KmeansTest2_DISABLED_Speed_Test::~AV1KmeansTest2_DISABLED_Speed_Test
          (AV1KmeansTest2_DISABLED_Speed_Test *this)

{
  void *in_RDI;
  
  ~AV1KmeansTest2_DISABLED_Speed_Test((AV1KmeansTest2_DISABLED_Speed_Test *)0x9eef28);
  operator_delete(in_RDI);
  return;
}

Assistant:

TEST_P(AV1KmeansTest2, DISABLED_Speed) {
  RunSpeedTest(GET_PARAM(0), GET_PARAM(1), 2);
  RunSpeedTest(GET_PARAM(0), GET_PARAM(1), 3);
  RunSpeedTest(GET_PARAM(0), GET_PARAM(1), 4);
  RunSpeedTest(GET_PARAM(0), GET_PARAM(1), 5);
  RunSpeedTest(GET_PARAM(0), GET_PARAM(1), 6);
  RunSpeedTest(GET_PARAM(0), GET_PARAM(1), 7);
  RunSpeedTest(GET_PARAM(0), GET_PARAM(1), 8);
}